

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::detail::ContextScopeBase::ContextScopeBase(ContextScopeBase *this,ContextScopeBase *other)

{
  vector<doctest::IContextScope_*,_std::allocator<doctest::IContextScope_*>_> *this_00;
  ContextScopeBase *local_20;
  ContextScopeBase *local_18;
  ContextScopeBase *other_local;
  ContextScopeBase *this_local;
  
  local_18 = other;
  other_local = this;
  IContextScope::IContextScope(&this->super_IContextScope);
  (this->super_IContextScope)._vptr_IContextScope = (_func_int **)&PTR__ContextScopeBase_0023ffa8;
  this->need_to_destroy = true;
  if ((local_18->need_to_destroy & 1U) != 0) {
    destroy(local_18);
  }
  local_18->need_to_destroy = false;
  this_00 = (vector<doctest::IContextScope_*,_std::allocator<doctest::IContextScope_*>_> *)
            g_infoContexts();
  local_20 = this;
  std::vector<doctest::IContextScope_*,_std::allocator<doctest::IContextScope_*>_>::push_back
            (this_00,(value_type *)&local_20);
  return;
}

Assistant:

ContextScopeBase::ContextScopeBase(ContextScopeBase&& other) noexcept {
        if (other.need_to_destroy) {
            other.destroy();
        }
        other.need_to_destroy = false;
        g_infoContexts.push_back(this);
    }